

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O1

void __thiscall
covenant::CycleBreaking<covenant::Sym>::cycle_breaking_transf
          (CycleBreaking<covenant::Sym> *this,CFG *g,vector<int,_std::allocator<int>_> *group,
          set<int,_std::less<int>,_std::allocator<int>_> *group_set)

{
  int iVar1;
  pointer pvVar2;
  pointer pPVar3;
  bool bVar4;
  Sym LHS;
  undefined1 *puVar5;
  pointer piVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong uVar10;
  vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> pi;
  unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
  new_non_terminals;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> r;
  TermFactory local_138;
  Rule local_128;
  CycleBreaking<covenant::Sym> *local_100;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *local_f8;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
  local_f0;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_c0;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_a8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
  local_60;
  
  if ((long)(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start != 4) {
    local_f0.super_functions<boost::hash<int>,_std::equal_to<int>_>.current_ = '\0';
    uVar7 = 0x26;
    puVar5 = boost::unordered::detail::prime_list_template<unsigned_long>::value;
    do {
      uVar10 = uVar7 >> 1;
      uVar9 = ~uVar10 + uVar7;
      uVar7 = uVar10;
      if (*(ulong *)((long)puVar5 + uVar10 * 8) < 0xb) {
        puVar5 = (undefined1 *)((ulong *)((long)puVar5 + uVar10 * 8) + 1);
        uVar7 = uVar9;
      }
    } while (0 < (long)uVar7);
    puVar8 = (ulong *)(boost::unordered::detail::prime_list_template<unsigned_long>::value + 0x128);
    if (puVar5 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
      puVar8 = (ulong *)puVar5;
    }
    local_f0.bucket_count_ = *puVar8;
    local_f0.size_ = 0;
    local_f0.mlf_ = 1.0;
    local_f0.max_load_ = 0;
    local_f0.buckets_ = (bucket_pointer)0x0;
    local_100 = this;
    local_f8 = &group_set->_M_t;
    if ((group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish !=
        (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start) {
      uVar7 = 0;
      uVar9 = 1;
      do {
        LHS = CFG::newVar(g);
        local_138.px = (g->_tfac).px;
        local_138.pn.pi_ = (g->_tfac).pn.pi_;
        if (local_138.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_138.pn.pi_)->use_count_ = (local_138.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        Rule::E(&local_128,&local_138);
        CFG::prod(g,LHS,&local_128);
        if (local_128._syms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128._syms.
                          super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        boost::detail::shared_count::~shared_count(&local_128._tfac.pn);
        boost::detail::shared_count::~shared_count(&local_138.pn);
        local_128._tfac.px =
             (element_type *)
             CONCAT44(LHS.x,(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar7]);
        boost::unordered::detail::
        table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
        ::emplace_unique<std::pair<int,covenant::Sym>>
                  ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
                    *)&local_f0,(const_key_type *)&local_128,(pair<int,_covenant::Sym> *)&local_128)
        ;
        bVar4 = uVar9 < (ulong)((long)(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                      .super__Vector_impl_data._M_finish -
                                (long)(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                      .super__Vector_impl_data._M_start >> 2);
        uVar7 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar4);
    }
    piVar6 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish != piVar6) {
      uVar7 = 0;
      do {
        std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::vector
                  ((vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> *)
                   &local_128,
                   (g->prods).
                   super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + piVar6[uVar7]);
        iVar1 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        pvVar2 = (g->prods).
                 super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar3 = pvVar2[iVar1].
                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar2[iVar1].
                     super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                     ._M_impl.super__Vector_impl_data + 8) != pPVar3) {
          *(pointer *)
           ((long)&pvVar2[iVar1].
                   super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                   ._M_impl.super__Vector_impl_data + 8) = pPVar3;
        }
        if ((element_type *)local_128._tfac.pn.pi_ != local_128._tfac.px) {
          uVar9 = 0;
          uVar10 = 1;
          do {
            std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                      (&local_a8,
                       (g->rules).
                       super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       *(int *)((long)&(local_128._tfac.px)->_next_id + uVar9 * 4));
            iVar1 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar7];
            std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector(&local_c0,&local_a8);
            boost::unordered::
            unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
            ::unordered_map((unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                             *)&local_60,
                            (unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                             *)&local_f0);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _Rb_tree(&local_90,local_f8);
            cycle_breaking_transf_rule
                      (local_100,g,iVar1,&local_c0,
                       (unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                        *)&local_60,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_90);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree(&local_90);
            boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
            ::~table(&local_60);
            if (local_c0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c0.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_a8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a8.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            bVar4 = uVar10 < (ulong)((long)local_128._tfac.pn.pi_ - (long)local_128._tfac.px >> 2);
            uVar9 = uVar10;
            uVar10 = (ulong)((int)uVar10 + 1);
          } while (bVar4);
        }
        if (local_128._tfac.px != (element_type *)0x0) {
          operator_delete(local_128._tfac.px);
        }
        uVar7 = (ulong)((int)uVar7 + 1);
        piVar6 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar7 < (ulong)((long)(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar6 >> 2));
    }
    boost::unordered::detail::
    table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
    ::~table(&local_f0);
  }
  return;
}

Assistant:

void  cycle_breaking_transf (CFG &g, 
                               const vector<int> &group, 
                               const set<int> &group_set)
  {
    if (group.size() == 1) return;

    boost::unordered_map<int, EdgeSym> new_non_terminals;
    for (unsigned nt=0; nt<group.size(); nt++)
    {
      // add epsilon productions
      EdgeSym A( g.newVar () );
      g.prod(A, Rule::E (g.getTermFactory ()));
      new_non_terminals.insert(make_pair(group[nt], A));
      // LOG ("abstraction" , 
      //      cout << "Added " << A << " -> e " <<  " from " 
      //           << EdgeSym::mkVar(group[nt]) << "\n");
           
    }
    // iterate over each nonterminal in the mutually recursive group 
    for (unsigned nt=0; nt<group.size(); nt++)
    {
      vector<CFG::ProdInfo> pi(g.prods[group[nt]]);
      g.prods[group[nt]].clear();
      // iterate over each rule in the production

      // LOG ("abstraction", 
      //      cout << "Production: "; g.printProduction(cout, group[nt]); cout << endl);

      for( unsigned int ri = 0; ri < pi.size(); ri++ )
      {
        vector<EdgeSym> r(g.rules[pi[ri].rule]);

        // LOG("abstraction", 
        //     cout << "\tRule: "; Rule(r, g.getTermFactory ()); cout << endl);

        cycle_breaking_transf_rule(g, 
                                   group[nt], 
                                   r, 
                                   new_non_terminals, 
                                   group_set);
      }
    }
  }